

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::combineRelationalConstants
          (OptimizeInstructions *this,Binary *binary,Binary *left,Const *leftConst,Binary *right,
          Const *rightConst)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  Literal local_c0;
  Literal local_a8;
  uintptr_t local_90;
  Literal local_88;
  uintptr_t local_60;
  undefined1 local_58 [8];
  Literal extra;
  Type type;
  Const *rightConst_local;
  Binary *right_local;
  Const *leftConst_local;
  Binary *left_local;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  extra.type.id = (binary->right->type).id;
  wasm::Literal::Literal((Literal *)local_58,&leftConst->value);
  BVar1 = left->op;
  local_60 = extra.type.id;
  BVar2 = Abstract::getBinary(extra.type,Sub);
  if (BVar1 == BVar2) {
    wasm::Literal::neg(&local_88,(Literal *)local_58);
    wasm::Literal::operator=((Literal *)local_58,&local_88);
    wasm::Literal::~Literal(&local_88);
  }
  if (right != (Binary *)0x0) {
    BVar1 = right->op;
    local_90 = extra.type.id;
    BVar2 = Abstract::getBinary(extra.type,Sub);
    if (BVar1 == BVar2) {
      wasm::Literal::neg(&local_a8,(Literal *)local_58);
      wasm::Literal::operator=((Literal *)local_58,&local_a8);
      wasm::Literal::~Literal(&local_a8);
    }
  }
  wasm::Literal::sub(&local_c0,&rightConst->value,(Literal *)local_58);
  wasm::Literal::operator=(&rightConst->value,&local_c0);
  wasm::Literal::~Literal(&local_c0);
  binary->left = left->left;
  wasm::Literal::~Literal((Literal *)local_58);
  return (Expression *)binary;
}

Assistant:

Expression* combineRelationalConstants(Binary* binary,
                                         Binary* left,
                                         Const* leftConst,
                                         Binary* right,
                                         Const* rightConst) {
    auto type = binary->right->type;
    // we fold constants to the right
    Literal extra = leftConst->value;
    if (left->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    if (right && right->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    rightConst->value = rightConst->value.sub(extra);
    binary->left = left->left;
    return binary;
  }